

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpris-core.c
# Opt level: O0

void media_player2_proxy_class_init(MediaPlayer2ProxyClass *klass)

{
  GObjectClass *klass_00;
  undefined8 uVar1;
  long lVar2;
  GDBusProxyClass *proxy_class;
  GObjectClass *gobject_class;
  MediaPlayer2ProxyClass *klass_local;
  
  klass_00 = (GObjectClass *)g_type_check_class_cast(klass,0x50);
  klass_00->finalize = media_player2_proxy_finalize;
  klass_00->get_property = media_player2_proxy_get_property;
  klass_00->set_property = media_player2_proxy_set_property;
  uVar1 = g_dbus_proxy_get_type();
  lVar2 = g_type_check_class_cast(klass,uVar1);
  *(code **)(lVar2 + 0x90) = media_player2_proxy_g_signal;
  *(code **)(lVar2 + 0x88) = media_player2_proxy_g_properties_changed;
  media_player2_override_properties(klass_00,1);
  return;
}

Assistant:

static void
media_player2_proxy_class_init (MediaPlayer2ProxyClass *klass)
{
  GObjectClass *gobject_class;
  GDBusProxyClass *proxy_class;

  gobject_class = G_OBJECT_CLASS (klass);
  gobject_class->finalize     = media_player2_proxy_finalize;
  gobject_class->get_property = media_player2_proxy_get_property;
  gobject_class->set_property = media_player2_proxy_set_property;

  proxy_class = G_DBUS_PROXY_CLASS (klass);
  proxy_class->g_signal = media_player2_proxy_g_signal;
  proxy_class->g_properties_changed = media_player2_proxy_g_properties_changed;

  media_player2_override_properties (gobject_class, 1);

#if GLIB_VERSION_MAX_ALLOWED < GLIB_VERSION_2_38
  g_type_class_add_private (klass, sizeof (MediaPlayer2ProxyPrivate));
#endif
}